

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s5.c
# Opt level: O0

char * s5_strerror(s5_err err)

{
  char *pcStack_10;
  s5_err err_local;
  
  switch(err) {
  case s5_ok:
    pcStack_10 = "No error.";
    break;
  case s5_auth_select:
    pcStack_10 = "Select authentication method.";
    break;
  case s5_auth_verify:
    pcStack_10 = "Verify authentication.";
    break;
  case s5_exec_cmd:
    pcStack_10 = "Execute command.";
    break;
  case s5_bad_atyp:
    pcStack_10 = "Bad address type.";
    break;
  case s5_bad_cmd:
    pcStack_10 = "Bad protocol command.";
    break;
  case s5_bad_version:
    pcStack_10 = "Bad protocol version.";
    break;
  default:
    pcStack_10 = "Unknown error.";
  }
  return pcStack_10;
}

Assistant:

const char *s5_strerror(s5_err err) {
#define S5_ERR_GEN(_, name, errmsg) case s5_ ## name: return errmsg;
  switch (err) {
    S5_ERR_MAP(S5_ERR_GEN)
    default: ;  /* Silence s5_max_errors -Wswitch warning. */
  }
#undef S5_ERR_GEN
  return "Unknown error.";
}